

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_data.hpp
# Opt level: O0

void __thiscall
boost::detail::thread_data_base::notify_all_at_thread_exit
          (thread_data_base *this,condition_variable *cv,mutex *m)

{
  vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
  *this_00;
  long in_RDI;
  value_type *in_stack_ffffffffffffffc8;
  pair<boost::condition_variable_*,_boost::mutex_*> local_28;
  mutex *local_18;
  condition_variable *local_10 [2];
  
  this_00 = (vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
             *)(in_RDI + 0x180);
  std::pair<boost::condition_variable_*,_boost::mutex_*>::
  pair<boost::condition_variable_*&,_boost::mutex_*&,_true>(&local_28,local_10,&local_18);
  std::
  vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
  ::push_back(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

virtual void notify_all_at_thread_exit(condition_variable* cv, mutex* m)
            {
              notify.push_back(std::pair<condition_variable*, mutex*>(cv, m));
            }